

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

void __thiscall PathTracer::create_noise_images(PathTracer *this,shared_ptr<myvk::Device> *device)

{
  __shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_48;
  VkExtent2D local_28;
  
  local_28.width = 0x100;
  local_28.height = 0x100;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Image::CreateTexture2D
            ((Image *)&local_58,device,&local_28,1,VK_FORMAT_R8G8_UNORM,6,&local_48);
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_noise_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_48);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &(this->m_noise_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  myvk::ImageView::Create
            ((ImageView *)&local_48,(Ptr<ImageBase> *)&local_58,VK_IMAGE_VIEW_TYPE_2D,1);
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_noise_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.
              super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  myvk::Sampler::Create
            ((Sampler *)&local_48,device,VK_FILTER_NEAREST,VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,
             VK_SAMPLER_MIPMAP_MODE_LINEAR,1000.0,false,1.0);
  std::__shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_noise_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.
              super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void PathTracer::create_noise_images(const std::shared_ptr<myvk::Device> &device) {
	m_noise_image = myvk::Image::CreateTexture2D(device, {kNoiseSize, kNoiseSize}, 1, VK_FORMAT_R8G8_UNORM,
	                                             VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_SAMPLED_BIT);
	m_noise_image_view = myvk::ImageView::Create(m_noise_image, VK_IMAGE_VIEW_TYPE_2D);
	m_noise_sampler = myvk::Sampler::Create(device, VK_FILTER_NEAREST, VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE);
}